

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

void Help(void)

{
  printf(
        "Usage: webpinfo [options] in_files\nNote: there could be multiple input files;\n      options must come before input files.\nOptions:\n  -version ........... Print version number and exit.\n  -quiet ............. Do not show chunk parsing information.\n  -diag .............. Show parsing error diagnosis.\n  -summary ........... Show chunk stats summary.\n  -bitstream_info .... Parse bitstream header.\n"
        );
  return;
}

Assistant:

static void Help(void) {
  printf("Usage: webpinfo [options] in_files\n"
         "Note: there could be multiple input files;\n"
         "      options must come before input files.\n"
         "Options:\n"
         "  -version ........... Print version number and exit.\n"
         "  -quiet ............. Do not show chunk parsing information.\n"
         "  -diag .............. Show parsing error diagnosis.\n"
         "  -summary ........... Show chunk stats summary.\n"
         "  -bitstream_info .... Parse bitstream header.\n");
}